

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptStackWalker::WalkToTarget(JavascriptStackWalker *this,JavascriptFunction *funcTarget)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  JavascriptFunction *pJVar4;
  CallInfo CVar5;
  undefined4 *puVar6;
  
  do {
    BVar3 = Walk(this,true);
    if (BVar3 == 0) {
      return 0;
    }
  } while ((((*(ushort *)&this->field_0x50 & 4) == 0 & ((byte)*(ushort *)&this->field_0x50 ^ 1)) !=
            0) || (pJVar4 = GetCurrentFunction(this,true), pJVar4 != funcTarget));
  CVar5 = GetCallInfo(this,true);
  if (CVar5._0_4_ < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x372,"(!(this->GetCallInfo().Flags & CallFlags_InternalFrame))",
                                "!(this->GetCallInfo().Flags & CallFlags_InternalFrame)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  return 1;
}

Assistant:

BOOL JavascriptStackWalker::WalkToTarget(JavascriptFunction * funcTarget)
    {
        // Walk up the call stack until we find the frame that belongs to the given function.

        while (this->Walk(/*includeInlineFrames*/ true))
        {
            if (this->IsJavascriptFrame() && this->GetCurrentFunction() == funcTarget)
            {
                // Skip internal names
                Assert( !(this->GetCallInfo().Flags & CallFlags_InternalFrame) );
                return true;
            }
        }

        return false;
    }